

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handheld-halting.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  type tVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  bool bVar4;
  int *piVar5;
  ostream *poVar6;
  const_iterator ppVar7;
  type *ptVar8;
  type *ptVar9;
  pointer piVar10;
  reference pvVar11;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  undefined8 in_RCX;
  machine_t mVar13;
  string_view sVar14;
  undefined1 local_33c [8];
  machine_t machine;
  program_t copy;
  size_t i;
  type *to;
  type *from;
  const_iterator __end1;
  const_iterator __begin1;
  ins_e local_2e0 [2];
  pair<handheld::ins_e,_handheld::ins_e> local_2d8;
  pair<handheld::ins_e,_handheld::ins_e> local_2d0;
  initializer_list<std::pair<handheld::ins_e,_handheld::ins_e>_> local_2c8;
  initializer_list<std::pair<handheld::ins_e,_handheld::ins_e>_> *local_2b8;
  initializer_list<std::pair<handheld::ins_e,_handheld::ins_e>_> *__range1;
  int local_2a8;
  undefined8 local_2a0;
  undefined4 local_298;
  undefined4 local_28c;
  undefined4 uStack_288;
  undefined4 local_284;
  initializer_list<std::pair<handheld::ins_e,_handheld::ins_e>_> *local_280;
  int local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  undefined1 local_258 [8];
  program_t program;
  basic_ifstream<char,_std::char_traits<char>_> *input;
  undefined1 local_228 [8];
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
  super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._520_8_ = argv;
  get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228,argc,argv
           );
  bVar4 = std::holds_alternative<int,int,std::ifstream>
                    ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228)
  ;
  if (bVar4) {
    piVar5 = std::get<int,int,std::ifstream>
                       ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                        local_228);
    argv_local._4_4_ = *piVar5;
  }
  else {
    program.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::get<std::ifstream,int,std::ifstream>
                            ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                             local_228);
    tokenize_abi_cxx11_<std::ifstream>
              (&local_270,
               (basic_ifstream<char,_std::char_traits<char>_> *)
               program.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    handheld::read_program((program_t *)local_258,&local_270);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_270);
    poVar6 = std::operator<<((ostream *)&std::cout,"Part 1: ");
    local_28c = 0;
    uStack_288 = 0;
    local_284 = 0;
    local_298 = 0;
    local_2a0 = 0;
    auVar2._4_8_ = 0;
    auVar2._0_4_ = (uint)in_RCX;
    mVar13 = handheld::execute((handheld *)local_258,(program_t *)0x0,(machine_t)(auVar2 << 0x40));
    local_2a8 = mVar13.r0;
    __range1 = mVar13._0_8_;
    local_280 = __range1;
    local_278 = local_2a8;
    poVar6 = operator<<(poVar6,(machine_t *)&local_280);
    std::operator<<(poVar6,"\n");
    local_2e0[1] = 1;
    local_2e0[0] = nop;
    std::pair<handheld::ins_e,_handheld::ins_e>::pair<handheld::ins_e,_handheld::ins_e,_true>
              (&local_2d8,local_2e0 + 1,local_2e0);
    __begin1._4_4_ = 0;
    __begin1._0_4_ = 1;
    std::pair<handheld::ins_e,_handheld::ins_e>::pair<handheld::ins_e,_handheld::ins_e,_true>
              (&local_2d0,(ins_e *)((long)&__begin1 + 4),(ins_e *)&__begin1);
    local_2c8._M_array = &local_2d8;
    local_2c8._M_len = 2;
    local_2b8 = &local_2c8;
    __end1 = std::initializer_list<std::pair<handheld::ins_e,_handheld::ins_e>_>::begin(local_2b8);
    ppVar7 = std::initializer_list<std::pair<handheld::ins_e,_handheld::ins_e>_>::end(local_2b8);
    for (; __end1 != ppVar7; __end1 = __end1 + 1) {
      ptVar8 = std::get<0ul,handheld::ins_e,handheld::ins_e>(__end1);
      ptVar9 = std::get<1ul,handheld::ins_e,handheld::ins_e>(__end1);
      for (copy.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          piVar10 = (pointer)std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::
                             size((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)
                                  local_258),
          copy.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < piVar10;
          copy.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(copy.
                                 super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->ins + 1)) {
        std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::vector
                  ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)&machine.pc,
                   (vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)local_258);
        pvVar11 = std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::operator[]
                            ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)
                             &machine.pc,
                             (size_type)
                             copy.
                             super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        mVar13.r0 = machine.exit;
        mVar13.exit = local_33c._0_4_;
        mVar13.pc = local_33c._4_4_;
        if (pvVar11->ins == *ptVar8) {
          tVar1 = *ptVar9;
          pvVar11 = std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::operator[]
                              ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)
                               &machine.pc,
                               (size_type)
                               copy.
                               super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar11->ins = tVar1;
          auVar3._4_8_ = 0;
          auVar3._0_4_ = tVar1;
          mVar13 = handheld::execute((handheld *)&machine.pc,(program_t *)0x0,
                                     (machine_t)(auVar3 << 0x40));
          machine.exit = mVar13.r0;
          local_33c._0_4_ = mVar13.exit;
          if (local_33c._0_4_ == normal) {
            local_33c = (undefined1  [8])mVar13._0_8_;
            poVar6 = std::operator<<((ostream *)&std::cout,"Part 2: Changed instruction ");
            poVar6 = (ostream *)
                     std::ostream::operator<<
                               (poVar6,(ulong)copy.
                                              super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar6 = std::operator<<(poVar6," ");
            sVar14 = handheld::ins_str(*ptVar8);
            pbVar12 = std::operator<<(poVar6,sVar14);
            poVar6 = std::operator<<(pbVar12," to ");
            sVar14 = handheld::ins_str(*ptVar9);
            pbVar12 = std::operator<<(poVar6,sVar14);
            poVar6 = std::operator<<(pbVar12,"; ");
            poVar6 = operator<<(poVar6,(machine_t *)local_33c);
            std::operator<<(poVar6,"\n");
            mVar13.r0 = machine.exit;
            mVar13.exit = local_33c._0_4_;
            mVar13.pc = local_33c._4_4_;
          }
        }
        machine.exit = mVar13.r0;
        local_33c = mVar13._0_8_;
        std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::~vector
                  ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)&machine.pc);
      }
    }
    std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::~vector
              ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)local_258);
  }
  std::variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::~variant
            ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228);
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  using namespace handheld;
  
  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto program = read_program(tokenize(input));

  std::cout << "Part 1: " << execute(program) << "\n";

  using from_to_t = std::pair<ins_e, ins_e>;
  for (const auto& [from, to] : { from_to_t{ins_e::jmp, ins_e::nop}, {ins_e::nop, ins_e::jmp} }) {
    for (size_t i = 0; i < program.size(); i++) {
      auto copy = program;
      if (copy[i].ins == from) {
        copy[i].ins = to;
        auto machine = execute(copy);
        if (machine.exit == machine_t::exit_e::normal)
          std::cout << "Part 2: Changed instruction " << i << " " << ins_str(from) << " to " << ins_str(to) << "; " << machine << "\n";
      }
    }
  }
}